

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thstd.c
# Opt level: O0

void std_write(thstd_t *std,char *filename)

{
  char *pcVar1;
  FILE *__stream;
  FILE *pFVar2;
  int *piVar3;
  char *pcVar4;
  void *local_b0;
  std_instr_t *local_a8;
  std_object_instance_t *local_a0;
  std_object_t *local_98;
  undefined8 *local_78;
  list_node_t *node_3;
  list_node_t *node_2;
  list_node_t *node_1;
  list_node_t *node;
  uint local_50;
  int32_t endcode;
  uint32_t entry_offset;
  uint32_t offset;
  std_instr_t *instr;
  std_object_instance_t *instance;
  std_object_t *quad;
  std_entry_t *entry;
  size_t i;
  FILE *stream;
  char *filename_local;
  thstd_t *std_local;
  
  stream = (FILE *)filename;
  filename_local = (char *)std;
  i = (size_t)fopen(filename,"wb");
  pFVar2 = stream;
  __stream = _stderr;
  pcVar1 = argv0;
  if ((FILE *)i == (FILE *)0x0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(__stream,"%s: couldn\'t open %s for writing: %s\n",pcVar1,pFVar2,pcVar4);
  }
  if (option_version == 0) {
    file_write((FILE *)i,*(void **)(filename_local + 0x18),0x490);
    endcode = 0x490;
  }
  else {
    file_write((FILE *)i,*(void **)(filename_local + 0x20),0x90);
    endcode = 0x90;
  }
  local_50 = endcode + (uint)**(ushort **)(filename_local + 0x10) * 4;
  entry = (std_entry_t *)0x0;
  node_1 = *(list_node_t **)(filename_local + 0x28);
  while( true ) {
    if (node_1 == (list_node_t *)0x0) {
      local_98 = (std_object_t *)0x0;
    }
    else {
      local_98 = (std_object_t *)node_1->data;
    }
    quad = local_98;
    if (node_1 == (list_node_t *)0x0) break;
    **(undefined2 **)local_98 = (short)entry;
    file_seek((FILE *)i,(ulong)(uint)endcode + (long)entry * 4);
    file_write((FILE *)i,&local_50,4);
    file_seek((FILE *)i,(ulong)local_50);
    file_write((FILE *)i,*(void **)quad,0x1c);
    node_2 = *(list_node_t **)&quad->x;
    while( true ) {
      local_50 = local_50 + 0x1c;
      if (node_2 == (list_node_t *)0x0) {
        local_a0 = (std_object_instance_t *)0x0;
      }
      else {
        local_a0 = (std_object_instance_t *)node_2->data;
      }
      instance = local_a0;
      if (node_2 == (list_node_t *)0x0) break;
      local_a0->unknown1 = 0x1c;
      file_write((FILE *)i,local_a0,0x1c);
      node_2 = node_2->next;
    }
    node._4_4_ = 0x4ffff;
    file_write((FILE *)i,(void *)((long)&node + 4),4);
    local_50 = local_50 + 4;
    entry = (std_entry_t *)((long)&entry->header + 1);
    node_1 = node_1->next;
  }
  node_3 = *(list_node_t **)(filename_local + 0x38);
  while( true ) {
    if (node_3 == (list_node_t *)0x0) {
      local_a8 = (std_instr_t *)0x0;
    }
    else {
      local_a8 = (std_instr_t *)node_3->data;
    }
    instr = local_a8;
    if (node_3 == (list_node_t *)0x0) break;
    file_write((FILE *)i,local_a8,0x10);
    node_3 = node_3->next;
  }
  node._4_4_ = 0xffffffff;
  for (entry = (std_entry_t *)0x0; entry < (std_entry_t *)0x4;
      entry = (std_entry_t *)((long)&entry->header + 1)) {
    file_write((FILE *)i,(void *)((long)&node + 4),4);
  }
  local_78 = *(undefined8 **)(filename_local + 0x50);
  while( true ) {
    if (local_78 == (undefined8 *)0x0) {
      local_b0 = (void *)0x0;
    }
    else {
      local_b0 = (void *)local_78[2];
    }
    _entry_offset = local_b0;
    if (local_78 == (undefined8 *)0x0) break;
    if (option_version == 0) {
      *(undefined2 *)((long)local_b0 + 6) = 0xc;
      file_write((FILE *)i,local_b0,(ulong)*(ushort *)((long)local_b0 + 6) + 8);
    }
    else {
      file_write((FILE *)i,local_b0,(ulong)*(ushort *)((long)local_b0 + 6));
    }
    local_78 = (undefined8 *)*local_78;
  }
  for (entry = (std_entry_t *)0x0; entry < (std_entry_t *)0x5;
      entry = (std_entry_t *)((long)&entry->header + 1)) {
    file_write((FILE *)i,(void *)((long)&node + 4),4);
  }
  fclose((FILE *)i);
  return;
}

Assistant:

static void
std_write(
          thstd_t* std,
          const char *filename)
{
    FILE *stream;
    size_t i;
    std_entry_t *entry;
    std_object_t *quad;
    std_object_instance_t *instance;
    std_instr_t *instr;
    uint32_t offset;
    uint32_t entry_offset;
    int32_t endcode;

    stream = fopen(filename, "wb");
    if (!stream) {
        fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
                argv0, filename, strerror(errno));
    }

    if (option_version == 0) {
        file_write(stream, std->header_06, sizeof(std_header_06_t));
        offset = sizeof(std_header_06_t);
    } else {
        file_write(stream, std->header_10, sizeof(std_header_10_t));
        offset = sizeof(std_header_10_t);
    }


    entry_offset = (offset +
                    sizeof(int32_t) * (uint32_t)std->header->nb_objects);

    i = 0;
    list_for_each(&std->entries, entry) {
        entry->header->id = i;

        file_seek(stream, offset + i*sizeof(int32_t));
        file_write(stream, &entry_offset, sizeof(uint32_t));

        file_seek(stream, entry_offset);
        file_write(stream, entry->header, sizeof(std_entry_header_t));
        entry_offset += sizeof(std_entry_header_t);

        list_for_each(&entry->quads, quad) {
            quad->size = 0x1c;
            file_write(stream, quad, sizeof(std_object_t));
            entry_offset += sizeof(std_object_t);
        }

        endcode = 0x0004FFFF;
        file_write(stream, &endcode, sizeof(int32_t));
        entry_offset += sizeof(int32_t);

        i++;
    }

    list_for_each(&std->instances, instance) {
        file_write(stream, instance, sizeof(std_object_instance_t));
    }

    endcode = 0xFFFFFFFF;
    for(i = 0; i < 4; i++)
        file_write(stream, &endcode, sizeof(int32_t));

    list_for_each(&std->instrs, instr) {
        if (option_version == 0) {
            instr->size = 12;
            file_write(stream, instr, instr->size + sizeof(uint32_t) * 2);
        }
        else
            file_write(stream, instr, instr->size);
    }

    for(i = 0; i < 5; i++)
        file_write(stream, &endcode, sizeof(int32_t));

    fclose(stream);
}